

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O1

int cram_huffman_decode_int(cram_slice *slice,cram_codec *c,cram_block *in,char *out,int *out_size)

{
  int iVar1;
  int iVar2;
  int iVar3;
  cram_huffman_code *pcVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  size_t sVar14;
  
  iVar1 = *out_size;
  if (0 < (long)iVar1) {
    iVar2 = (c->field_6).huffman.ncodes;
    pcVar4 = (c->field_6).huffman.codes;
    lVar10 = 0;
    do {
      uVar9 = 0;
      iVar11 = 0;
      iVar6 = 0;
      iVar7 = 0;
      do {
        iVar3 = pcVar4[(int)uVar9].len;
        iVar12 = 1;
        uVar13 = iVar3 - iVar7;
        if ((uVar13 == 0 || iVar3 < iVar7) ||
           ((in->alloc - in->byte) * 8 + 7 + (long)in->bit < (ulong)uVar13)) {
LAB_00156c09:
          bVar5 = false;
        }
        else {
          sVar14 = in->byte;
          uVar8 = in->bit;
          iVar7 = iVar7 - iVar3;
          do {
            iVar11 = (uint)((in->data[sVar14] >> (uVar8 & 0x1f) & 1) != 0) + iVar11 * 2;
            sVar14 = sVar14 + ((int)uVar8 < 1);
            in->byte = sVar14;
            uVar8 = uVar8 - 1 & 7;
            in->bit = uVar8;
            iVar7 = iVar7 + 1;
          } while (iVar7 != 0);
          iVar7 = uVar13 + iVar6;
          uVar9 = iVar11 - pcVar4[(int)uVar9].p;
          iVar6 = iVar7;
          if (iVar2 <= (int)uVar9 || (int)uVar9 < 0) goto LAB_00156c09;
          bVar5 = true;
          if ((pcVar4[uVar9].code == iVar11) && (pcVar4[uVar9].len == iVar7)) {
            *(int32_t *)(out + lVar10 * 4) = pcVar4[uVar9].symbol;
            iVar12 = 5;
            bVar5 = false;
          }
          else {
            iVar12 = 0;
          }
        }
      } while (iVar12 == 0);
      if ((iVar12 != 5) && (!bVar5)) {
        return -1;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != iVar1);
  }
  return 0;
}

Assistant:

int cram_huffman_decode_int(cram_slice *slice, cram_codec *c,
			    cram_block *in, char *out, int *out_size) {
    int32_t *out_i = (int32_t *)out;
    int i, n, ncodes = c->huffman.ncodes;
    const cram_huffman_code * const codes = c->huffman.codes;

    for (i = 0, n = *out_size; i < n; i++) {
	int idx = 0;
	int val = 0, len = 0, last_len = 0;

	// Now one bit at a time for remaining checks
	for (;;) {
	    int dlen = codes[idx].len - last_len;
	    if (dlen <= 0 || (in->alloc - in->byte)*8 + in->bit + 7 < dlen)
		return -1;
	    
	    //val <<= dlen;
	    //val  |= get_bits_MSB(in, dlen);
	    //last_len = (len += dlen);

	    last_len = (len += dlen);
	    for (; dlen; dlen--) GET_BIT_MSB(in, val);

	    idx = val - codes[idx].p;
	    if (idx >= ncodes || idx < 0)
		return -1;

	    if (codes[idx].code == val && codes[idx].len == len) {
		out_i[i] = codes[idx].symbol;
		break;
	    }
	}
    }

    return 0;
}